

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.h
# Opt level: O2

int __thiscall Assimp::LWOImporter::ReadVSizedIntLWO2(LWOImporter *this,uint8_t **inout)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint uVar5;
  long lStack_8;
  
  pbVar3 = *inout;
  bVar1 = *pbVar3;
  pbVar4 = pbVar3 + 1;
  *inout = pbVar4;
  if (bVar1 == 0xff) {
    bVar1 = pbVar3[1];
    *inout = pbVar3 + 2;
    bVar2 = pbVar3[2];
    pbVar4 = pbVar3 + 3;
    *inout = pbVar4;
    uVar5 = (uint)bVar2 << 8 | (uint)bVar1 << 0x10;
    lStack_8 = 4;
  }
  else {
    uVar5 = (uint)bVar1 << 8;
    lStack_8 = 2;
  }
  bVar1 = *pbVar4;
  *inout = pbVar3 + lStack_8;
  return bVar1 | uVar5;
}

Assistant:

inline int LWOImporter::ReadVSizedIntLWO2(uint8_t*& inout)
{
    int i;
    int c = *inout;inout++;
    if(c != 0xFF)
    {
        i = c << 8;
        c = *inout;inout++;
        i |= c;
    }
    else
    {
        c = *inout;inout++;
        i = c << 16;
        c = *inout;inout++;
        i |= c << 8;
        c = *inout;inout++;
        i |= c;
    }
    return i;
}